

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::GetBBox(ON_Mesh *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_BoundingBox *this_00;
  int iVar1;
  bool bVar2;
  ON_BoundingBox vbox;
  ON_BoundingBox local_c8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_BoundingBox local_60;
  
  if ((this->m_F).m_count == 0) {
    return false;
  }
  if (2 < (uint)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) {
    this_00 = &this->m_vertex_bbox;
    bVar2 = ON_BoundingBox::IsNotEmpty(this_00);
    if (((!bVar2) &&
        (((iVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, iVar1 == 0 ||
          (iVar1 != (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count)) ||
         (bVar2 = ON_BoundingBox::Set(this_00,&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,0),
         !bVar2)))) &&
       (bVar2 = ON_BoundingBox::Set(this_00,&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,0), !bVar2
       )) {
      return false;
    }
    local_c8.m_min.x = (this_00->m_min).x;
    local_c8.m_min.y = (this->m_vertex_bbox).m_min.y;
    local_c8.m_min.z = (this->m_vertex_bbox).m_min.z;
    local_c8.m_max.x = (this->m_vertex_bbox).m_max.x;
    local_c8.m_max.y = (this->m_vertex_bbox).m_max.y;
    local_c8.m_max.z = (this->m_vertex_bbox).m_max.z;
    if (bGrowBox) {
      ON_3dPoint::ON_3dPoint(&local_78,boxmin);
      ON_3dPoint::ON_3dPoint(&local_90,boxmax);
      ON_BoundingBox::ON_BoundingBox(&local_60,&local_78,&local_90);
      ON_BoundingBox::Union(&local_c8,&local_60);
    }
    *boxmin = local_c8.m_min.x;
    boxmin[1] = local_c8.m_min.y;
    boxmin[2] = local_c8.m_min.z;
    *boxmax = local_c8.m_max.x;
    boxmax[1] = local_c8.m_max.y;
    boxmax[2] = local_c8.m_max.z;
    return true;
  }
  return false;
}

Assistant:

bool ON_Mesh::GetBBox( // returns true if successful
       double* boxmin, // minimum
       double* boxmax, // maximum
       bool bGrowBox
       ) const
{
  bool rc = false;
  const unsigned int facet_count  = FaceCount();
  const unsigned int vertex_count = VertexCount();
  if ( facet_count >= 1 && vertex_count >= 3 ) 
  {
    rc = m_vertex_bbox.IsNotEmpty();
    if ( false == rc ) 
    {
      if ( HasDoublePrecisionVertices() )
      {
        const ON_3dPointArray& dV = DoublePrecisionVertices();
        if ( dV.UnsignedCount() == m_V.UnsignedCount() )
          rc = m_vertex_bbox.Set(dV, false);
      }
      if (false == rc)
      {
        rc = m_vertex_bbox.Set(m_V, false);
      }
    }

    if ( rc ) 
    {
      ON_BoundingBox vbox(m_vertex_bbox);
      if ( bGrowBox )
      {
        vbox.Union( ON_BoundingBox(ON_3dPoint(boxmin),ON_3dPoint(boxmax)) );
      }
      boxmin[0] = vbox.m_min.x;
      boxmin[1] = vbox.m_min.y;
      boxmin[2] = vbox.m_min.z;
      boxmax[0] = vbox.m_max.x;
      boxmax[1] = vbox.m_max.y;
      boxmax[2] = vbox.m_max.z;
    }
  }
  return rc;
}